

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void rapidjson::SkipWhitespace<rapidjson::BasicIStreamWrapper<std::istream>>
               (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  Ch CVar1;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RDI;
  Ch c;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *s;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  copy;
  undefined6 in_stack_ffffffffffffffe0;
  bool bVar2;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  local_10 [2];
  
  internal::
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  ::StreamLocalCopy(local_10,in_RDI);
  while( true ) {
    CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                      (local_10[0].s);
    bVar2 = true;
    if (((CVar1 != ' ') && (bVar2 = true, CVar1 != '\n')) && (bVar2 = true, CVar1 != '\r')) {
      bVar2 = CVar1 == '\t';
    }
    if (bVar2 == false) break;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
               CONCAT17(CVar1,CONCAT16(bVar2,in_stack_ffffffffffffffe0)));
  }
  return;
}

Assistant:

void SkipWhitespace(InputStream& is) {
    internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    typename InputStream::Ch c;
    while ((c = s.Peek()) == ' ' || c == '\n' || c == '\r' || c == '\t')
        s.Take();
}